

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void yy_switch_to_buffer(YY_BUFFER_STATE new_buffer)

{
  YY_BUFFER_STATE in_RDI;
  YY_BUFFER_STATE local_10;
  
  yyensure_buffer_stack();
  if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
    local_10 = (YY_BUFFER_STATE)0x0;
  }
  else {
    local_10 = yy_buffer_stack[yy_buffer_stack_top];
  }
  if (local_10 != in_RDI) {
    if ((yy_buffer_stack != (YY_BUFFER_STATE *)0x0) &&
       (yy_buffer_stack[yy_buffer_stack_top] != (YY_BUFFER_STATE)0x0)) {
      *yy_c_buf_p = yy_hold_char;
      yy_buffer_stack[yy_buffer_stack_top]->yy_buf_pos = yy_c_buf_p;
      yy_buffer_stack[yy_buffer_stack_top]->yy_n_chars = yy_n_chars;
    }
    yy_buffer_stack[yy_buffer_stack_top] = in_RDI;
    yy_load_buffer_state();
    yy_did_buffer_switch_on_eof = 1;
  }
  return;
}

Assistant:

void yy_switch_to_buffer  (YY_BUFFER_STATE  new_buffer )
{
    
	/* TODO. We should be able to replace this entire function body
	 * with
	 *		yypop_buffer_state();
	 *		yypush_buffer_state(new_buffer);
     */
	yyensure_buffer_stack ();
	if ( YY_CURRENT_BUFFER == new_buffer )
		return;

	if ( YY_CURRENT_BUFFER )
		{
		/* Flush out information for old buffer. */
		*(yy_c_buf_p) = (yy_hold_char);
		YY_CURRENT_BUFFER_LVALUE->yy_buf_pos = (yy_c_buf_p);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars);
		}

	YY_CURRENT_BUFFER_LVALUE = new_buffer;
	yy_load_buffer_state(  );

	/* We don't actually know whether we did this switch during
	 * EOF (yywrap()) processing, but the only time this flag
	 * is looked at is after yywrap() is called, so it's safe
	 * to go ahead and always set it.
	 */
	(yy_did_buffer_switch_on_eof) = 1;
}